

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O1

char * __thiscall CVmMemoryStream::read_line(CVmMemoryStream *this,char *buf,size_t len)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  ulong uVar5;
  
  pcVar4 = (char *)0x0;
  if (((len != 0) && (buf != (char *)0x0)) && (this->p_ < this->buf_ + this->buflen_)) {
    pcVar4 = buf;
    if (1 < len) {
      uVar5 = len - 1;
      while (pcVar2 = this->p_, pcVar2 < this->buf_ + this->buflen_) {
        this->p_ = pcVar2 + 1;
        cVar1 = *pcVar2;
        if ((cVar1 == '\r') || (cVar1 == '\n')) {
          *pcVar4 = '\n';
          pcVar2 = this->p_;
          if (pcVar2 < this->buf_ + this->buflen_) {
            if (cVar1 == '\r') {
              if (*pcVar2 == '\n') goto LAB_001e8858;
            }
            else if ((cVar1 == '\n') && (*pcVar2 == '\r')) {
LAB_001e8858:
              this->p_ = pcVar2 + 1;
            }
          }
          bVar3 = false;
        }
        else {
          *pcVar4 = cVar1;
          bVar3 = true;
        }
        pcVar4 = pcVar4 + 1;
        if ((!bVar3) || (bVar3 = uVar5 < 2, uVar5 = uVar5 - 1, bVar3)) break;
      }
    }
    *pcVar4 = '\0';
    pcVar4 = buf;
  }
  return pcVar4;
}

Assistant:

char *read_line(char *buf, size_t len)
    {
        /* if already at EOF, or there's no buffer, return null */
        if (p_ >= buf_ + buflen_ || buf == 0 || len == 0)
            return 0;

        /* read bytes until we fill the buffer or reach '\n' or EOF */
        char *dst;
        size_t rem;
        for (dst = buf, rem = len ; rem > 1 && p_ < buf_ + buflen_ ; --rem)
        {
            /* get this character */
            char c = *p_++;

            /* check for newlines */
            if (c == '\n' || c == '\r')
            {
                /* write CR and LF as simply CR */
                *dst++ = '\n';

                /* if we have a CR-LF or LF-CR sequence, skip the pair */
                if (p_ < buf_ + buflen_
                    && ((c == '\n' && *p_ == '\r')
                        || (c == '\r' && *p_ == '\n')))
                    p_ += 1;

                /* done */
                break;
            }

            /* copy this character */
            *dst++ = c;
        }

        /* add the trailing null and return the buffer */
        *dst = '\0';
        return buf;
    }